

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O2

const_iterator __thiscall bloaty::RangeMap::FindContaining(RangeMap *this,uint64_t addr)

{
  bool bVar1;
  const_iterator cVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter;
  uint64_t local_18;
  
  local_18 = addr;
  cVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
          ::upper_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                         *)this,&local_18);
  if (cVar2._M_node != (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    iter._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar2._M_node);
    bVar1 = EntryContains<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (this,iter,local_18);
    if (bVar1) {
      return (const_iterator)iter._M_node;
    }
  }
  return (const_iterator)&(this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header;
}

Assistant:

RangeMap::Map::const_iterator RangeMap::FindContaining(uint64_t addr) const {
  auto it = mappings_.upper_bound(addr);  // Entry directly after.
  if (it == mappings_.begin() || (--it, !EntryContains(it, addr))) {
    return mappings_.end();
  } else {
    return it;
  }
}